

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_deserialize_safe(void *buf,size_t maxbytes)

{
  roaring_bitmap_t *prVar1;
  ulong uVar2;
  ulong uVar3;
  roaring_bulk_context_t context;
  roaring_bulk_context_t local_38;
  
  if (maxbytes != 0) {
    if (*buf == '\x02') {
      prVar1 = roaring_bitmap_portable_deserialize_safe((char *)((long)buf + 1),maxbytes - 1);
      return prVar1;
    }
    if ((((*buf == '\x01') && (4 < maxbytes)) &&
        (uVar2 = (ulong)*(uint *)((long)buf + 1), uVar2 * 4 + 5 <= maxbytes)) &&
       (prVar1 = (roaring_bitmap_t *)(*global_memory_hook.malloc)(0x28),
       prVar1 != (roaring_bitmap_t *)0x0)) {
      (prVar1->high_low_container).keys = (uint16_t *)0x0;
      (prVar1->high_low_container).typecodes = (uint8_t *)0x0;
      (prVar1->high_low_container).size = 0;
      (prVar1->high_low_container).allocation_size = 0;
      (prVar1->high_low_container).containers = (void **)0x0;
      (prVar1->high_low_container).flags = '\0';
      local_38.container = (void *)0x0;
      local_38.idx = 0;
      local_38.key = 0;
      local_38.typecode = '\0';
      local_38._15_1_ = 0;
      if (uVar2 == 0) {
        return prVar1;
      }
      uVar3 = 0;
      do {
        roaring_bitmap_add_bulk(prVar1,&local_38,*(uint32_t *)((long)buf + uVar3 * 4 + 5));
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      return prVar1;
    }
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_deserialize_safe(const void *buf,
                                                  size_t maxbytes) {
    if (maxbytes < 1) {
        return NULL;
    }

    const char *bufaschar = (const char *)buf;
    if (bufaschar[0] == CROARING_SERIALIZATION_ARRAY_UINT32) {
        if (maxbytes < 1 + sizeof(uint32_t)) {
            return NULL;
        }

        /* This looks like a compressed set of uint32_t elements */
        uint32_t card;
        memcpy(&card, bufaschar + 1, sizeof(uint32_t));

        // Check the buffer is big enough to contain card uint32_t elements
        if (maxbytes < 1 + sizeof(uint32_t) + card * sizeof(uint32_t)) {
            return NULL;
        }

        const uint32_t *elems =
            (const uint32_t *)(bufaschar + 1 + sizeof(uint32_t));

        roaring_bitmap_t *bitmap = roaring_bitmap_create();
        if (bitmap == NULL) {
            return NULL;
        }
        roaring_bulk_context_t context = CROARING_ZERO_INITIALIZER;
        for (uint32_t i = 0; i < card; i++) {
            // elems may not be aligned, read with memcpy
            uint32_t elem;
            memcpy(&elem, elems + i, sizeof(elem));
            roaring_bitmap_add_bulk(bitmap, &context, elem);
        }
        return bitmap;

    } else if (bufaschar[0] == CROARING_SERIALIZATION_CONTAINER) {
        return roaring_bitmap_portable_deserialize_safe(bufaschar + 1,
                                                        maxbytes - 1);
    } else
        return (NULL);
}